

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_def.c
# Opt level: O0

_Bool upb_MessageDef_MiniDescriptorEncode(upb_MessageDef *m,upb_Arena *a,upb_StringView *out)

{
  _Bool _Var1;
  undefined1 local_68 [8];
  upb_DescState s;
  upb_StringView *out_local;
  upb_Arena *a_local;
  upb_MessageDef *m_local;
  
  s.ptr = (char *)out;
  _upb_DescState_Init((upb_DescState *)local_68);
  _Var1 = _upb_DescState_Grow((upb_DescState *)local_68,a);
  if (_Var1) {
    _Var1 = upb_MessageDef_IsMapEntry(m);
    if (_Var1) {
      _Var1 = _upb_MessageDef_EncodeMap((upb_DescState *)local_68,m,a);
      if (!_Var1) {
        return false;
      }
    }
    else {
      _Var1 = google_protobuf_MessageOptions_message_set_wire_format(m->opts);
      if (_Var1) {
        _Var1 = _upb_MessageDef_EncodeMessageSet((upb_DescState *)local_68,m,a);
        if (!_Var1) {
          return false;
        }
      }
      else {
        _Var1 = _upb_MessageDef_EncodeMessage((upb_DescState *)local_68,m,a);
        if (!_Var1) {
          return false;
        }
      }
    }
    _Var1 = _upb_DescState_Grow((upb_DescState *)local_68,a);
    if (_Var1) {
      *s.buf = '\0';
      *(size_t *)s.ptr = s.bufsize;
      *(size_t *)(s.ptr + 8) = (long)s.buf - s.bufsize;
      m_local._7_1_ = true;
    }
    else {
      m_local._7_1_ = false;
    }
  }
  else {
    m_local._7_1_ = false;
  }
  return m_local._7_1_;
}

Assistant:

bool upb_MessageDef_MiniDescriptorEncode(const upb_MessageDef* m, upb_Arena* a,
                                         upb_StringView* out) {
  upb_DescState s;
  _upb_DescState_Init(&s);

  if (!_upb_DescState_Grow(&s, a)) return false;

  if (upb_MessageDef_IsMapEntry(m)) {
    if (!_upb_MessageDef_EncodeMap(&s, m, a)) return false;
  } else if (UPB_DESC(MessageOptions_message_set_wire_format)(m->opts)) {
    if (!_upb_MessageDef_EncodeMessageSet(&s, m, a)) return false;
  } else {
    if (!_upb_MessageDef_EncodeMessage(&s, m, a)) return false;
  }

  if (!_upb_DescState_Grow(&s, a)) return false;
  *s.ptr = '\0';

  out->data = s.buf;
  out->size = s.ptr - s.buf;
  return true;
}